

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyError
               (TestContext *testCtx,Functions *gl,GLenum expected)

{
  qpTestResult qVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  GLenum local_20;
  GLenum local_1c;
  deUint32 got;
  GLenum expected_local;
  Functions *gl_local;
  TestContext *testCtx_local;
  
  local_1c = expected;
  _got = gl;
  gl_local = (Functions *)testCtx;
  local_20 = (*gl->getError)();
  if (local_20 != local_1c) {
    this = tcu::TestContext::getLog((TestContext *)gl_local);
    tcu::TestLog::operator<<(&local_1a0,this,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [20])"// ERROR: expected ");
    EVar3 = glu::getErrorStr(local_1c);
    local_1d0 = EVar3.m_getName;
    local_1c8 = EVar3.m_value;
    local_1c0[0].m_getName = local_1d0;
    local_1c0[0].m_value = local_1c8;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1c0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])0x2b7cef6);
    EVar3 = glu::getErrorStr(local_20);
    local_1e0.m_getName = EVar3.m_getName;
    local_1e0.m_value = EVar3.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e0);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)gl_local);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"Got invalid error");
    }
  }
  return;
}

Assistant:

void verifyError (tcu::TestContext& testCtx, const glw::Functions& gl, GLenum expected)
{
	deUint32 got = gl.getError();
	if (got != expected)
	{
		testCtx.getLog() << tcu::TestLog::Message << "// ERROR: expected " << glu::getErrorStr(expected) << "; got " << glu::getErrorStr(got) << tcu::TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}